

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O1

void * deMemPool_alloc(deMemPool *pool,size_t numBytes)

{
  deMemPoolUtil *pdVar1;
  int iVar2;
  MemPage *pMVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  
  pMVar3 = pool->currentPage;
  iVar5 = pMVar3->bytesAllocated;
  pvVar4 = (void *)((long)&pMVar3[1].bytesAllocated + (long)iVar5 + 3 & 0xfffffffffffffff8);
  lVar6 = (long)pvVar4 - ((long)&pMVar3->capacity + (long)iVar5);
  iVar2 = (int)lVar6;
  if ((ulong)(long)(pMVar3->capacity - iVar5) < (lVar6 + numBytes) - 0x10) {
    iVar5 = pMVar3->capacity * 2;
    if (0x1f9f < iVar5) {
      iVar5 = 0x1fa0;
    }
    iVar2 = (int)numBytes + 4;
    if (iVar5 <= iVar2) {
      iVar5 = iVar2;
    }
    pMVar3 = (MemPage *)deMalloc((long)iVar5 + 0x10);
    if (pMVar3 == (MemPage *)0x0) {
      pMVar3 = (MemPage *)0x0;
    }
    else {
      pMVar3->capacity = 0;
      pMVar3->bytesAllocated = 0;
      pMVar3->nextPage = (MemPage *)0x0;
      pMVar3->capacity = iVar5;
    }
    if (pMVar3 == (MemPage *)0x0) {
      pvVar4 = (void *)0x0;
      goto LAB_00110684;
    }
    pMVar3->nextPage = pool->currentPage;
    pool->currentPage = pMVar3;
    pvVar4 = (void *)((ulong)((long)&pMVar3[1].bytesAllocated + 3U) & 0xfffffffffffffff8);
    iVar2 = (int)pvVar4 - (int)pMVar3;
  }
  pMVar3->bytesAllocated = pMVar3->bytesAllocated + iVar2 + -0x10 + (int)numBytes;
LAB_00110684:
  if ((pvVar4 == (void *)0x0) && (pdVar1 = pool->util, pdVar1 != (deMemPoolUtil *)0x0)) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return pvVar4;
}

Assistant:

void* deMemPool_alloc (deMemPool* pool, size_t numBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	ptr = deMemPool_allocInternal(pool, numBytes, DE_POOL_DEFAULT_ALLOC_ALIGNMENT);
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}